

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

void __thiscall ChannelConverter::convert(ChannelConverter *this,void *src,float *dst,ALuint frames)

{
  int iVar1;
  undefined4 in_ECX;
  size_t in_RDX;
  void *in_RSI;
  float *in_RDI;
  float unaff_retaddr;
  size_t in_stack_00000008;
  ALuint in_stack_00000014;
  float scale;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  float *dst_00;
  
  if (*(char *)(in_RDI + 3) == '\0') {
    dst_00 = in_RDI;
    iVar1 = PopCount<unsigned_int>((uint)in_RDI[2]);
    std::sqrt((double)(ulong)(uint)(1.0 / (float)iVar1));
    switch(*(undefined1 *)in_RDI) {
    case 0:
      anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)0>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,dst_00,in_RSI,in_RDX);
      break;
    case 1:
      anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)1>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,dst_00,in_RSI,in_RDX);
      break;
    case 2:
      anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)2>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,dst_00,in_RSI,in_RDX);
      break;
    case 3:
      anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)3>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,dst_00,in_RSI,in_RDX);
      break;
    case 4:
      anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)4>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,dst_00,in_RSI,in_RDX);
      break;
    case 5:
      anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)5>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,dst_00,in_RSI,in_RDX);
      break;
    case 6:
      anon_unknown.dwarf_f0b3e::Multi2Mono<(DevFmtType)6>
                (in_stack_00000014,in_stack_00000008,unaff_retaddr,dst_00,in_RSI,in_RDX);
    }
  }
  else if ((in_RDI[2] == 1.4013e-45) && (*(char *)(in_RDI + 3) == '\x01')) {
    switch(*(undefined1 *)in_RDI) {
    case 0:
      anon_unknown.dwarf_f0b3e::Mono2Stereo<(DevFmtType)0>
                ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0);
      break;
    case 1:
      anon_unknown.dwarf_f0b3e::Mono2Stereo<(DevFmtType)1>
                ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0);
      break;
    case 2:
      anon_unknown.dwarf_f0b3e::Mono2Stereo<(DevFmtType)2>
                ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0);
      break;
    case 3:
      anon_unknown.dwarf_f0b3e::Mono2Stereo<(DevFmtType)3>
                ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0);
      break;
    case 4:
      anon_unknown.dwarf_f0b3e::Mono2Stereo<(DevFmtType)4>
                ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0);
      break;
    case 5:
      anon_unknown.dwarf_f0b3e::Mono2Stereo<(DevFmtType)5>
                ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0);
      break;
    case 6:
      anon_unknown.dwarf_f0b3e::Mono2Stereo<(DevFmtType)6>
                ((float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                 in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void ChannelConverter::convert(const void *src, float *dst, ALuint frames) const
{
    if(mDstChans == DevFmtMono)
    {
        const float scale{std::sqrt(1.0f / static_cast<float>(PopCount(mChanMask)))};
        switch(mSrcType)
        {
#define HANDLE_FMT(T) case T: Multi2Mono<T>(mChanMask, mSrcStep, scale, dst, src, frames); break
        HANDLE_FMT(DevFmtByte);
        HANDLE_FMT(DevFmtUByte);
        HANDLE_FMT(DevFmtShort);
        HANDLE_FMT(DevFmtUShort);
        HANDLE_FMT(DevFmtInt);
        HANDLE_FMT(DevFmtUInt);
        HANDLE_FMT(DevFmtFloat);
#undef HANDLE_FMT
        }
    }
    else if(mChanMask == 0x1 && mDstChans == DevFmtStereo)
    {
        switch(mSrcType)
        {
#define HANDLE_FMT(T) case T: Mono2Stereo<T>(dst, src, frames); break
        HANDLE_FMT(DevFmtByte);
        HANDLE_FMT(DevFmtUByte);
        HANDLE_FMT(DevFmtShort);
        HANDLE_FMT(DevFmtUShort);
        HANDLE_FMT(DevFmtInt);
        HANDLE_FMT(DevFmtUInt);
        HANDLE_FMT(DevFmtFloat);
#undef HANDLE_FMT
        }
    }
}